

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O1

int __thiscall
Solution::clone(Solution *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  __fn *__fn_00;
  undefined4 extraout_var;
  _List_node_base *p_Var2;
  void *extraout_RDX;
  void *__child_stack_00;
  void *extraout_RDX_00;
  iterator __end1;
  Solution *pSVar3;
  
  __fn_00 = (__fn *)operator_new(0x20);
  *(undefined8 *)__fn_00 = 0;
  *(undefined8 *)(__fn_00 + 8) = 0;
  *(undefined8 *)(__fn_00 + 0x10) = 0;
  *(undefined8 *)(__fn_00 + 0x18) = 0;
  *(__fn **)(__fn_00 + 8) = __fn_00;
  *(__fn **)__fn_00 = __fn_00;
  *(undefined8 *)(__fn_00 + 0x10) = 0;
  __child_stack_00 = extraout_RDX;
  for (pSVar3 = (Solution *)
                (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; pSVar3 != this;
      pSVar3 = (Solution *)
               (pSVar3->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node.super__List_node_base._M_next) {
    iVar1 = Vehicle::clone((Vehicle *)
                           (pSVar3->vehicles).
                           super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
                           _M_size,__fn_00,__child_stack_00,__flags,__arg);
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)CONCAT44(extraout_var,iVar1);
    std::__detail::_List_node_base::_M_hook(p_Var2);
    *(long *)(__fn_00 + 0x10) = *(long *)(__fn_00 + 0x10) + 1;
    __child_stack_00 = extraout_RDX_00;
  }
  *(double *)(__fn_00 + 0x18) = this->weight;
  return (int)__fn_00;
}

Assistant:

Solution *Solution::clone() {
    auto s = new Solution();
    for (auto vehicle: this->vehicles) {
        s->vehicles.push_back(vehicle->clone(s));
    }
    s->weight = this->weight;
    return s;
}